

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

void __thiscall nv::Kernel2::initSobel(Kernel2 *this)

{
  int local_29c;
  float local_298;
  int i_2;
  float elements_2 [81];
  int local_14c;
  float local_148;
  int i_1;
  float elements_1 [49];
  int local_7c;
  float local_78;
  int i;
  float elements [25];
  Kernel2 *this_local;
  
  if (this->m_windowSize == 3) {
    *this->m_data = -1.0;
    this->m_data[1] = 0.0;
    this->m_data[2] = 1.0;
    this->m_data[3] = -2.0;
    this->m_data[4] = 0.0;
    this->m_data[5] = 2.0;
    this->m_data[6] = -1.0;
    this->m_data[7] = 0.0;
    this->m_data[8] = 1.0;
  }
  else {
    unique0x100001fb = this;
    if (this->m_windowSize == 5) {
      memcpy(&local_78,&DAT_002e8630,100);
      for (local_7c = 0; local_7c < 0x19; local_7c = local_7c + 1) {
        this->m_data[local_7c] = (&local_78)[local_7c];
      }
    }
    else if (this->m_windowSize == 7) {
      memcpy(&local_148,&DAT_002e86a0,0xc4);
      for (local_14c = 0; local_14c < 0x31; local_14c = local_14c + 1) {
        this->m_data[local_14c] = (&local_148)[local_14c];
      }
    }
    else if (this->m_windowSize == 9) {
      memcpy(&local_298,&DAT_002e8770,0x144);
      for (local_29c = 0; local_29c < 0x51; local_29c = local_29c + 1) {
        this->m_data[local_29c] = (&local_298)[local_29c];
      }
    }
  }
  return;
}

Assistant:

void Kernel2::initSobel()
{
	if (m_windowSize == 3)
	{
		m_data[0] = -1; m_data[1] = 0; m_data[2] = 1;
		m_data[3] = -2; m_data[4] = 0; m_data[5] = 2;
		m_data[6] = -1; m_data[7] = 0; m_data[8] = 1;
	}
	else if (m_windowSize == 5)
	{
		float elements[] = {
            -1, -2, 0, 2, 1,
            -2, -3, 0, 3, 2,
            -3, -4, 0, 4, 3,
            -2, -3, 0, 3, 2,
            -1, -2, 0, 2, 1
		};

		for (int i = 0; i < 5*5; i++) {
			m_data[i] = elements[i];
		}
	}
	else if (m_windowSize == 7)
	{
		float elements[] = {
            -1, -2, -3, 0, 3, 2, 1,
            -2, -3, -4, 0, 4, 3, 2,
            -3, -4, -5, 0, 5, 4, 3,
            -4, -5, -6, 0, 6, 5, 4,
            -3, -4, -5, 0, 5, 4, 3,
            -2, -3, -4, 0, 4, 3, 2,
            -1, -2, -3, 0, 3, 2, 1
		};

		for (int i = 0; i < 7*7; i++) {
			m_data[i] = elements[i];
		}
	}
	else if (m_windowSize == 9)
	{
		float elements[] = {
            -1, -2, -3, -4, 0, 4, 3, 2, 1,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -5, -6, -7, -8, 0, 8, 7, 6, 5,
            -4, -5, -6, -7, 0, 7, 6, 5, 4,
            -3, -4, -5, -6, 0, 6, 5, 4, 3,
            -2, -3, -4, -5, 0, 5, 4, 3, 2,
            -1, -2, -3, -4, 0, 4, 3, 2, 1
		};
		
		for (int i = 0; i < 9*9; i++) {
			m_data[i] = elements[i];
		}
	}
}